

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  LightSampleContext ctx;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  SampledWavelengths lambda_00;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3f wiRender;
  Vector3f woRender;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  bool bVar46;
  undefined8 *in_RDX;
  long in_RDI;
  RayDifferential *in_R8;
  type tVar47;
  Float FVar49;
  Point2f PVar50;
  type tVar48;
  undefined8 uVar54;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar56;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  char (*pacVar57) [4];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined8 uVar55;
  undefined1 auVar53 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  Vector3<float> VVar62;
  Vector3f VVar63;
  Tuple3<pbrt::Vector3,_float> TVar64;
  SampledSpectrum SVar65;
  SampledSpectrum SVar66;
  float vb;
  Float va;
  Vector3f wi_1;
  Float pdf;
  BSDFSample bs;
  Float u;
  SampledSpectrum f;
  Vector3f wi;
  LightLiSample ls;
  Point2f uLight;
  optional<pbrt::SampledLight> sampledLight;
  Vector3f wo;
  BSDF bsdf;
  SurfaceInteraction *isect;
  LightHandle *light;
  const_iterator __end4;
  const_iterator __begin4;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *__range4;
  optional<pbrt::ShapeIntersection> si;
  int depth;
  bool specularBounce;
  SampledSpectrum beta;
  SampledSpectrum L;
  Interval<float> in_stack_fffffffffffff438;
  Interval<float> in_stack_fffffffffffff440;
  Interval<float> in_stack_fffffffffffff448;
  Ray *in_stack_fffffffffffff450;
  Integrator *in_stack_fffffffffffff458;
  Interaction *in_stack_fffffffffffff460;
  Interaction *in_stack_fffffffffffff468;
  SurfaceInteraction *in_stack_fffffffffffff470;
  SampledWavelengths *in_stack_fffffffffffff478;
  SampledSpectrum *in_stack_fffffffffffff480;
  Interaction *in_stack_fffffffffffff488;
  int in_stack_fffffffffffff490;
  float in_stack_fffffffffffff498;
  float in_stack_fffffffffffff49c;
  undefined4 in_stack_fffffffffffff4a0;
  int in_stack_fffffffffffff4a4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff4a8;
  undefined4 uStack_b50;
  LogLevel in_stack_fffffffffffff4b4;
  char (*in_stack_fffffffffffff4c0) [15];
  float *in_stack_fffffffffffff4c8;
  char (*in_stack_fffffffffffff4d0) [4];
  float *in_stack_fffffffffffff4d8;
  undefined4 in_stack_fffffffffffff4e0;
  type in_stack_fffffffffffff4e4;
  undefined8 in_stack_fffffffffffff4e8;
  undefined8 in_stack_fffffffffffff4f0;
  undefined8 in_stack_fffffffffffff4f8;
  char (*in_stack_fffffffffffff500) [15];
  BxDFReflTransFlags in_stack_fffffffffffff508;
  float in_stack_fffffffffffff50c;
  undefined4 in_stack_fffffffffffff510;
  float in_stack_fffffffffffff514;
  float in_stack_fffffffffffff51c;
  undefined4 in_stack_fffffffffffff520;
  Float in_stack_fffffffffffff524;
  type in_stack_fffffffffffff528;
  type in_stack_fffffffffffff52c;
  float in_stack_fffffffffffff530;
  float in_stack_fffffffffffff534;
  undefined8 in_stack_fffffffffffff538;
  float in_stack_fffffffffffff540;
  undefined4 uStack_abc;
  Tuple3<pbrt::Vector3,_float> in_stack_fffffffffffff548;
  ShapeIntersection *in_stack_fffffffffffff7c8;
  ShapeIntersection *in_stack_fffffffffffff7d0;
  undefined7 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7df;
  RayDifferential *ray_00;
  ShapeIntersection *this_00;
  SamplerHandle *in_stack_fffffffffffff800;
  BSDFSample local_490;
  Float local_46c;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428;
  undefined8 local_420;
  Tuple3<pbrt::Vector3,_float> local_418;
  undefined8 local_408;
  float local_400;
  Tuple3<pbrt::Vector3,_float> local_3f8;
  undefined8 local_3e8;
  float local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  Tuple3<pbrt::Vector3,_float> local_3b8;
  Interaction *local_3a8;
  SurfaceInteraction *pSStack_3a0;
  SampledWavelengths *pSStack_398;
  SampledSpectrum *pSStack_390;
  undefined8 local_380;
  undefined1 local_378 [32];
  Integrator *pIStack_358;
  Interaction *pIStack_350;
  LightLiSample local_348;
  undefined8 local_2d0;
  optional local_2c8 [24];
  undefined8 local_2b0;
  float local_2a8;
  undefined8 local_29c;
  float local_294;
  undefined1 local_290 [80];
  Tuple3<pbrt::Vector3,_float> local_240;
  undefined8 local_230;
  float local_228;
  undefined8 local_220;
  float local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  ShapeIntersection *local_1e0;
  int local_1d4;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  reference local_190;
  LightHandle *local_188;
  __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
  local_180;
  long local_178;
  optional local_160 [264];
  int local_58;
  byte local_51;
  RayDifferential *local_38;
  undefined8 *local_28;
  array<float,_4> local_10;
  undefined1 auVar58 [56];
  undefined1 auVar61 [56];
  
  local_38 = in_R8;
  local_28 = in_RDX;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff440,in_stack_fffffffffffff438.high);
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff440,in_stack_fffffffffffff438.high);
  TVar64.z = in_stack_fffffffffffff534;
  TVar64.x = (float)(int)in_stack_fffffffffffff538;
  TVar64.y = (float)(int)((ulong)in_stack_fffffffffffff538 >> 0x20);
  SVar66.values.values[2] = (float)(int)in_stack_fffffffffffff4e8;
  SVar66.values.values[3] = (float)(int)((ulong)in_stack_fffffffffffff4e8 >> 0x20);
  SVar66.values.values[0] = (float)(int)in_stack_fffffffffffff4f8;
  SVar66.values.values[1] = (float)(int)((ulong)in_stack_fffffffffffff4f8 >> 0x20);
  local_51 = 1;
  local_58 = 0;
  do {
    bVar46 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffff448);
    if (!bVar46) {
      return (SampledSpectrum)(array<float,_4>)local_10.values;
    }
    auVar51 = ZEXT464(0x7f800000);
    Integrator::Intersect
              (in_stack_fffffffffffff458,in_stack_fffffffffffff450,in_stack_fffffffffffff448.high);
    bVar46 = pstd::optional::operator_cast_to_bool(local_160);
    auVar58 = auVar51._8_56_;
    if (bVar46) {
      local_1e0 = pstd::optional<pbrt::ShapeIntersection>::operator->
                            ((optional<pbrt::ShapeIntersection> *)0x798cde);
      if (((*(byte *)(in_RDI + 0x6c) & 1) == 0) || ((local_51 & 1) != 0)) {
        VVar62 = Tuple3<pbrt::Vector3,_float>::operator-
                           ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff440);
        local_228 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar51._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar51._8_56_ = auVar58;
        in_stack_fffffffffffff800 = (SamplerHandle *)0x0;
        uVar54 = auVar58._0_8_;
        local_230 = vmovlpd_avx(auVar51._0_16_);
        local_220 = local_230;
        local_218 = local_228;
        SVar65 = SurfaceInteraction::Le
                           (in_stack_fffffffffffff470,(Vector3f *)in_stack_fffffffffffff468,
                            (SampledWavelengths *)in_stack_fffffffffffff460);
        auVar38._8_8_ = uVar54;
        auVar38._0_8_ = SVar65.values.values._8_8_;
        auVar39._8_8_ = in_stack_fffffffffffff800;
        auVar39._0_8_ = SVar65.values.values._0_8_;
        local_210 = vmovlpd_avx(auVar39);
        local_208 = vmovlpd_avx(auVar38);
        SVar65 = SampledSpectrum::operator*
                           ((SampledSpectrum *)in_stack_fffffffffffff448,
                            (SampledSpectrum *)in_stack_fffffffffffff440);
        auVar36._8_8_ = in_stack_fffffffffffff800;
        auVar36._0_8_ = SVar65.values.values._8_8_;
        auVar37._8_8_ = uVar54;
        auVar37._0_8_ = SVar65.values.values._0_8_;
        local_200 = vmovlpd_avx(auVar37);
        local_1f8 = vmovlpd_avx(auVar36);
        SVar65 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff440);
        auVar34._8_8_ = uVar54;
        auVar34._0_8_ = SVar65.values.values._8_8_;
        auVar35._8_8_ = in_stack_fffffffffffff800;
        auVar35._0_8_ = SVar65.values.values._0_8_;
        local_240._0_8_ = vmovlpd_avx(auVar35);
        unique0x00006b80 = vmovlpd_avx(auVar34);
        SVar65 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff450,
                         (SampledSpectrum *)in_stack_fffffffffffff448);
        auVar32._8_8_ = in_stack_fffffffffffff800;
        auVar32._0_8_ = SVar65.values.values._8_8_;
        auVar58 = ZEXT856(in_stack_fffffffffffff800);
        auVar33._8_8_ = uVar54;
        auVar33._0_8_ = SVar65.values.values._0_8_;
        in_ZMM1 = ZEXT1664(auVar33);
        local_1f0 = vmovlpd_avx(auVar33);
        local_1e8 = vmovlpd_avx(auVar32);
        SampledSpectrum::operator+=
                  ((SampledSpectrum *)in_stack_fffffffffffff450,
                   (SampledSpectrum *)in_stack_fffffffffffff448);
      }
      if (local_58 == *(int *)(in_RDI + 0x68)) {
        local_1d4 = 3;
        local_58 = local_58 + 1;
      }
      else {
        this_00 = local_1e0;
        local_58 = local_58 + 1;
        CameraHandle::CameraHandle
                  ((CameraHandle *)in_stack_fffffffffffff440,
                   (CameraHandle *)in_stack_fffffffffffff438);
        ray_00 = local_38;
        SamplerHandle::SamplerHandle
                  ((SamplerHandle *)in_stack_fffffffffffff440,
                   (SamplerHandle *)in_stack_fffffffffffff438);
        in_stack_fffffffffffff438 = (Interval<float>)local_290;
        SurfaceInteraction::GetBSDF
                  (&this_00->intr,ray_00,
                   (SampledWavelengths *)
                   CONCAT17(in_stack_fffffffffffff7df,in_stack_fffffffffffff7d8),
                   (CameraHandle *)in_stack_fffffffffffff7d0,
                   (ScratchBuffer *)in_stack_fffffffffffff7c8,in_stack_fffffffffffff800);
        in_stack_fffffffffffff7df = BSDF::operator_cast_to_bool((BSDF *)0x798fbc);
        if ((bool)in_stack_fffffffffffff7df) {
          VVar62 = Tuple3<pbrt::Vector3,_float>::operator-
                             ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff440);
          local_2a8 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar53._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
          auVar53._8_56_ = auVar58;
          local_2b0 = vmovlpd_avx(auVar53._0_16_);
          local_29c = local_2b0;
          local_294 = local_2a8;
          if ((*(byte *)(in_RDI + 0x6c) & 1) != 0) {
            SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff440);
            UniformLightSampler::Sample
                      ((UniformLightSampler *)in_stack_fffffffffffff478,
                       (Float)((ulong)in_stack_fffffffffffff470 >> 0x20));
            bVar46 = pstd::optional::operator_cast_to_bool(local_2c8);
            if (bVar46) {
              PVar50 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff438);
              auVar31._8_8_ = extraout_XMM0_Qb;
              auVar31._0_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.x;
              auVar31._4_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.y;
              local_2d0 = vmovlpd_avx(auVar31);
              pstd::optional<pbrt::SampledLight>::operator->
                        ((optional<pbrt::SampledLight> *)0x799152);
              LightSampleContext::LightSampleContext
                        ((LightSampleContext *)local_378,&local_1e0->intr);
              local_380 = local_2d0;
              in_stack_fffffffffffff468 = (Interaction *)*local_28;
              in_stack_fffffffffffff470 = (SurfaceInteraction *)local_28[1];
              in_stack_fffffffffffff478 = (SampledWavelengths *)local_28[2];
              in_stack_fffffffffffff480 = (SampledSpectrum *)local_28[3];
              ctx.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y =
                   (Interval<float>)in_stack_fffffffffffff4c8;
              ctx.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x =
                   (Interval<float>)in_stack_fffffffffffff4c0;
              ctx.pi.super_Point3<pbrt::Interval<float>_>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z =
                   (Interval<float>)in_stack_fffffffffffff4d0;
              ctx.n.super_Tuple3<pbrt::Normal3,_float>._0_8_ = in_stack_fffffffffffff4d8;
              ctx.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)in_stack_fffffffffffff4e0;
              ctx.ns.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffff4e4;
              ctx.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)SVar66.values.values._8_8_;
              ctx.ns.super_Tuple3<pbrt::Normal3,_float>.z =
                   (float)(int)((ulong)SVar66.values.values._8_8_ >> 0x20);
              lambda_00.lambda.values[2] = (float)(int)SVar66.values.values._0_8_;
              lambda_00.lambda.values[3] = (float)(int)((ulong)SVar66.values.values._0_8_ >> 0x20);
              lambda_00.lambda.values[0] = (float)(int)in_stack_fffffffffffff4f0;
              lambda_00.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffff4f0 >> 0x20);
              lambda_00.pdf.values._0_8_ = in_stack_fffffffffffff500;
              lambda_00.pdf.values[2] = (float)in_stack_fffffffffffff508;
              lambda_00.pdf.values[3] = in_stack_fffffffffffff50c;
              in_stack_fffffffffffff438 = (Interval<float>)local_378._0_8_;
              in_stack_fffffffffffff440 = (Interval<float>)local_378._8_8_;
              in_stack_fffffffffffff448 = (Interval<float>)local_378._16_8_;
              in_stack_fffffffffffff450 = (Ray *)local_378._24_8_;
              in_stack_fffffffffffff458 = pIStack_358;
              in_stack_fffffffffffff460 = pIStack_350;
              local_3a8 = in_stack_fffffffffffff468;
              pSStack_3a0 = in_stack_fffffffffffff470;
              pSStack_398 = in_stack_fffffffffffff478;
              pSStack_390 = in_stack_fffffffffffff480;
              LightHandle::SampleLi
                        ((LightHandle *)
                         CONCAT44(in_stack_fffffffffffff4a4,in_stack_fffffffffffff4a0),ctx,
                         (Point2f)in_stack_fffffffffffff4a8,lambda_00,
                         (LightSamplingMode)in_stack_fffffffffffff49c);
              bVar46 = LightLiSample::operator_cast_to_bool(&local_348);
              if ((bVar46) &&
                 (bVar46 = SampledSpectrum::operator_cast_to_bool
                                     ((SampledSpectrum *)in_stack_fffffffffffff448), bVar46)) {
                local_3b8.z = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_3b8.x = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                local_3b8.y = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                local_3e0 = local_294;
                local_3e8 = local_29c;
                local_3f8.z = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_3f8.x = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                local_3f8.y = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                local_400 = local_294;
                local_408 = local_29c;
                uVar54 = 0;
                uVar55 = 0;
                local_418.z = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                local_418.x = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                local_418.y = local_348.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                VVar63.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff52c;
                VVar63.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff528;
                VVar63.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff530;
                SVar65 = BSDF::f((BSDF *)CONCAT44(in_stack_fffffffffffff514,
                                                  in_stack_fffffffffffff510),
                                 (Vector3f)in_stack_fffffffffffff548,VVar63,
                                 (TransportMode)in_stack_fffffffffffff50c);
                auVar29._8_8_ = uVar55;
                auVar29._0_8_ = SVar65.values.values._8_8_;
                auVar30._8_8_ = uVar54;
                auVar30._0_8_ = SVar65.values.values._0_8_;
                local_3d8 = vmovlpd_avx(auVar30);
                local_3d0 = vmovlpd_avx(auVar29);
                AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                              (Normal3<float> *)in_stack_fffffffffffff438);
                uVar55 = 0;
                SVar65 = SampledSpectrum::operator*
                                   ((SampledSpectrum *)in_stack_fffffffffffff440,
                                    in_stack_fffffffffffff438.high);
                auVar27._8_8_ = uVar54;
                auVar27._0_8_ = SVar65.values.values._8_8_;
                auVar28._8_8_ = uVar55;
                auVar28._0_8_ = SVar65.values.values._0_8_;
                local_3c8 = vmovlpd_avx(auVar28);
                local_3c0 = vmovlpd_avx(auVar27);
                bVar46 = SampledSpectrum::operator_cast_to_bool
                                   ((SampledSpectrum *)in_stack_fffffffffffff448);
                if ((bVar46) &&
                   (bVar46 = Integrator::Unoccluded
                                       ((Integrator *)in_stack_fffffffffffff470,
                                        in_stack_fffffffffffff468,in_stack_fffffffffffff460), bVar46
                   )) {
                  SVar65 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)in_stack_fffffffffffff448,
                                      (SampledSpectrum *)in_stack_fffffffffffff440);
                  auVar25._8_8_ = uVar55;
                  auVar25._0_8_ = SVar65.values.values._8_8_;
                  auVar26._8_8_ = uVar54;
                  auVar26._0_8_ = SVar65.values.values._0_8_;
                  local_448 = vmovlpd_avx(auVar26);
                  local_440 = vmovlpd_avx(auVar25);
                  SVar65 = SampledSpectrum::operator*
                                     ((SampledSpectrum *)in_stack_fffffffffffff448,
                                      (SampledSpectrum *)in_stack_fffffffffffff440);
                  auVar23._8_8_ = uVar54;
                  auVar23._0_8_ = SVar65.values.values._8_8_;
                  auVar24._8_8_ = uVar55;
                  auVar24._0_8_ = SVar65.values.values._0_8_;
                  local_438 = vmovlpd_avx(auVar24);
                  local_430 = vmovlpd_avx(auVar23);
                  pstd::optional<pbrt::SampledLight>::operator->
                            ((optional<pbrt::SampledLight> *)0x7994be);
                  uVar56 = 0;
                  uVar54 = 0;
                  SVar65 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff440);
                  uVar55 = 0;
                  auVar21._8_8_ = uVar56;
                  auVar21._0_8_ = SVar65.values.values._8_8_;
                  auVar22._8_8_ = uVar54;
                  auVar22._0_8_ = SVar65.values.values._0_8_;
                  local_468 = vmovlpd_avx(auVar22);
                  local_460 = vmovlpd_avx(auVar21);
                  SVar65 = pbrt::operator*(in_stack_fffffffffffff440.high,
                                           (SampledSpectrum *)in_stack_fffffffffffff438);
                  auVar19._8_8_ = uVar56;
                  auVar19._0_8_ = SVar65.values.values._8_8_;
                  auVar20._8_8_ = uVar55;
                  auVar20._0_8_ = SVar65.values.values._0_8_;
                  local_458 = vmovlpd_avx(auVar20);
                  local_450 = vmovlpd_avx(auVar19);
                  SVar65 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff450,
                                   (SampledSpectrum *)in_stack_fffffffffffff448);
                  auVar17._8_8_ = uVar55;
                  auVar17._0_8_ = SVar65.values.values._8_8_;
                  auVar18._8_8_ = uVar56;
                  auVar18._0_8_ = SVar65.values.values._0_8_;
                  local_428 = vmovlpd_avx(auVar18);
                  local_420 = vmovlpd_avx(auVar17);
                  SampledSpectrum::operator+=
                            ((SampledSpectrum *)in_stack_fffffffffffff450,
                             (SampledSpectrum *)in_stack_fffffffffffff448);
                }
              }
            }
            pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x79961b);
          }
          if ((*(byte *)(in_RDI + 0x6d) & 1) == 0) {
            Vector3<float>::Vector3((Vector3<float> *)0x799899);
            bVar46 = BSDF::HasReflection((BSDF *)0x7998a6);
            if ((bVar46) && (bVar46 = BSDF::HasTransmission((BSDF *)0x7998cc), bVar46)) {
              PVar50 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff438);
              auVar12._8_8_ = extraout_XMM0_Qb_01;
              auVar12._0_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.x;
              auVar12._4_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.y;
              vmovlpd_avx(auVar12);
              uVar54 = extraout_XMM0_Qb_01;
              VVar63 = SampleUniformSphere((Point2f *)in_stack_fffffffffffff460);
              auVar11._8_8_ = uVar54;
              auVar11._0_8_ = VVar63.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              vmovlpd_avx(auVar11);
              UniformSpherePDF();
            }
            else {
              PVar50 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff438);
              auVar10._8_8_ = extraout_XMM0_Qb_02;
              auVar10._0_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.x;
              auVar10._4_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.y;
              vmovlpd_avx(auVar10);
              uVar54 = extraout_XMM0_Qb_02;
              VVar63 = SampleUniformHemisphere((Point2f *)in_stack_fffffffffffff460);
              auVar9._8_8_ = uVar54;
              auVar9._0_8_ = VVar63.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              vmovlpd_avx(auVar9);
              UniformHemispherePDF();
              bVar46 = BSDF::HasReflection((BSDF *)0x799a91);
              if (bVar46) {
                tVar47 = Dot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                                    (Normal3<float> *)in_stack_fffffffffffff438);
                tVar48 = Dot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                                    (Normal3<float> *)in_stack_fffffffffffff438);
                uVar54 = 0;
                if (tVar47 * tVar48 < 0.0) {
                  TVar64 = (Tuple3<pbrt::Vector3,_float>)
                           Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff440);
                  in_stack_fffffffffffff540 = (float)uVar54;
                  uStack_abc = (undefined4)((ulong)uVar54 >> 0x20);
                  auVar8._8_4_ = in_stack_fffffffffffff540;
                  auVar8._0_8_ = TVar64._0_8_;
                  auVar8._12_4_ = uStack_abc;
                  vmovlpd_avx(auVar8);
                  goto LAB_00799cb3;
                }
              }
              bVar46 = BSDF::HasTransmission((BSDF *)0x799ba9);
              in_stack_fffffffffffff530 = (float)CONCAT13(bVar46,SUB43(in_stack_fffffffffffff530,0))
              ;
              if (bVar46) {
                in_stack_fffffffffffff52c =
                     Dot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                                (Normal3<float> *)in_stack_fffffffffffff438);
                in_stack_fffffffffffff528 =
                     Dot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                                (Normal3<float> *)in_stack_fffffffffffff438);
                uVar54 = 0;
                if (0.0 < in_stack_fffffffffffff52c * in_stack_fffffffffffff528) {
                  VVar62 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffff440);
                  in_stack_fffffffffffff514 = VVar62.super_Tuple3<pbrt::Vector3,_float>.z;
                  in_stack_fffffffffffff51c = VVar62.super_Tuple3<pbrt::Vector3,_float>.y;
                  in_stack_fffffffffffff520 = (undefined4)uVar54;
                  in_stack_fffffffffffff524 = (Float)((ulong)uVar54 >> 0x20);
                  auVar7._8_4_ = in_stack_fffffffffffff520;
                  auVar7._0_8_ = VVar62.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar7._12_4_ = in_stack_fffffffffffff524;
                  vmovlpd_avx(auVar7);
                }
              }
            }
LAB_00799cb3:
            in_stack_fffffffffffff4c0 = (char (*) [15])0x0;
            in_stack_fffffffffffff4f0 = 0;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff52c;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff528;
            wiRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff530;
            SVar66 = BSDF::f((BSDF *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                             (Vector3f)in_stack_fffffffffffff548,wiRender,
                             (TransportMode)in_stack_fffffffffffff50c);
            auVar5._8_8_ = in_stack_fffffffffffff4f0;
            auVar5._0_8_ = SVar66.values.values._8_8_;
            auVar6._8_8_ = in_stack_fffffffffffff4c0;
            auVar6._0_8_ = SVar66.values.values._0_8_;
            vmovlpd_avx(auVar6);
            vmovlpd_avx(auVar5);
            in_stack_fffffffffffff500 = in_stack_fffffffffffff4c0;
            in_stack_fffffffffffff4e4 =
                 AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                               (Normal3<float> *)in_stack_fffffffffffff438);
            pacVar57 = (char (*) [4])0x0;
            SVar65 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff440,
                                in_stack_fffffffffffff438.high);
            in_stack_fffffffffffff4c8 = SVar65.values.values._0_8_;
            auVar3._8_8_ = in_stack_fffffffffffff4c0;
            auVar3._0_8_ = SVar65.values.values._8_8_;
            auVar4._8_8_ = pacVar57;
            auVar4._0_8_ = in_stack_fffffffffffff4c8;
            vmovlpd_avx(auVar4);
            vmovlpd_avx(auVar3);
            uVar54 = 0;
            in_stack_fffffffffffff4d0 = pacVar57;
            SVar65 = SampledSpectrum::operator/
                               ((SampledSpectrum *)in_stack_fffffffffffff448,
                                in_stack_fffffffffffff440.high);
            in_stack_fffffffffffff4a8 = SVar65.values.values._0_8_;
            in_stack_fffffffffffff498 = SVar65.values.values[2];
            in_stack_fffffffffffff49c = SVar65.values.values[3];
            in_stack_fffffffffffff4a0 = SUB84(pacVar57,0);
            in_stack_fffffffffffff4a4 = (int)((ulong)pacVar57 >> 0x20);
            uStack_b50 = (undefined4)uVar54;
            in_stack_fffffffffffff4b4 = (LogLevel)((ulong)uVar54 >> 0x20);
            auVar1._8_4_ = in_stack_fffffffffffff4a0;
            auVar1._0_8_ = SVar65.values.values._8_8_;
            auVar1._12_4_ = in_stack_fffffffffffff4a4;
            auVar2._8_4_ = uStack_b50;
            auVar2._0_4_ = in_stack_fffffffffffff4a8.x;
            auVar2._4_4_ = in_stack_fffffffffffff4a8.y;
            auVar2._12_4_ = in_stack_fffffffffffff4b4;
            in_ZMM1 = ZEXT1664(auVar2);
            vmovlpd_avx(auVar2);
            vmovlpd_avx(auVar1);
            SampledSpectrum::operator*=
                      ((SampledSpectrum *)in_stack_fffffffffffff450,
                       (SampledSpectrum *)in_stack_fffffffffffff448);
            local_51 = 0;
            Interaction::SpawnRay(in_stack_fffffffffffff488,(Vector3f *)in_stack_fffffffffffff480);
            RayDifferential::operator=
                      ((RayDifferential *)in_stack_fffffffffffff440,
                       (RayDifferential *)in_stack_fffffffffffff438);
          }
          else {
            local_46c = SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff440);
            PVar50 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff438);
            auVar16._8_8_ = extraout_XMM0_Qb_00;
            auVar16._0_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.x;
            auVar16._4_4_ = PVar50.super_Tuple2<pbrt::Point2,_float>.y;
            vmovlpd_avx(auVar16);
            in_ZMM1 = ZEXT464(0);
            woRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff540;
            woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)TVar64._0_8_;
            woRender.super_Tuple3<pbrt::Vector3,_float>.y =
                 (float)(int)((ulong)TVar64._0_8_ >> 0x20);
            BSDF::Sample_f((BSDF *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                           woRender,in_stack_fffffffffffff51c,
                           (Point2f *)CONCAT44(in_stack_fffffffffffff514,in_stack_fffffffffffff510),
                           (TransportMode)in_stack_fffffffffffff50c,in_stack_fffffffffffff508);
            bVar46 = BSDFSample::operator_cast_to_bool(&local_490);
            auVar58 = in_ZMM1._8_56_;
            if (!bVar46) {
              local_1d4 = 3;
              goto LAB_00799f4e;
            }
            AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff440,
                          (Normal3<float> *)in_stack_fffffffffffff438);
            uVar54 = 0;
            SVar65 = SampledSpectrum::operator*
                               ((SampledSpectrum *)in_stack_fffffffffffff440,
                                in_stack_fffffffffffff438.high);
            auVar60._0_8_ = SVar65.values.values._8_8_;
            auVar60._8_56_ = auVar58;
            auVar15._8_8_ = uVar54;
            auVar15._0_8_ = SVar65.values.values._0_8_;
            vmovlpd_avx(auVar15);
            vmovlpd_avx(auVar60._0_16_);
            uVar55 = 0;
            SVar65 = SampledSpectrum::operator/
                               ((SampledSpectrum *)in_stack_fffffffffffff448,
                                in_stack_fffffffffffff440.high);
            auVar13._8_8_ = uVar54;
            auVar13._0_8_ = SVar65.values.values._8_8_;
            auVar14._8_8_ = uVar55;
            auVar14._0_8_ = SVar65.values.values._0_8_;
            in_ZMM1 = ZEXT1664(auVar14);
            vmovlpd_avx(auVar14);
            vmovlpd_avx(auVar13);
            SampledSpectrum::operator*=
                      ((SampledSpectrum *)in_stack_fffffffffffff450,
                       (SampledSpectrum *)in_stack_fffffffffffff448);
            local_51 = BSDFSample::IsSpecular((BSDFSample *)0x799838);
            Interaction::SpawnRay(in_stack_fffffffffffff488,(Vector3f *)in_stack_fffffffffffff480);
            RayDifferential::operator=
                      ((RayDifferential *)in_stack_fffffffffffff440,
                       (RayDifferential *)in_stack_fffffffffffff438);
          }
          FVar49 = SampledSpectrum::y(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
          if (FVar49 < 0.0) {
            LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                      (in_stack_fffffffffffff4b4,(char *)in_stack_fffffffffffff4a8,
                       in_stack_fffffffffffff4a4,
                       (char *)CONCAT44(in_stack_fffffffffffff49c,in_stack_fffffffffffff498),
                       (char (*) [15])CONCAT44(FVar49,in_stack_fffffffffffff490),
                       (char (*) [4])in_stack_fffffffffffff488,in_stack_fffffffffffff4c0,
                       in_stack_fffffffffffff4c8,in_stack_fffffffffffff4d0,in_stack_fffffffffffff4d8
                      );
          }
          local_1d4 = 0;
        }
        else {
          in_stack_fffffffffffff7c8 = local_1e0;
          in_stack_fffffffffffff7d0 =
               pstd::optional<pbrt::ShapeIntersection>::operator->
                         ((optional<pbrt::ShapeIntersection> *)0x798fef);
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)CONCAT44(TVar64.z,in_stack_fffffffffffff530),
                     (RayDifferential *)
                     CONCAT44(in_stack_fffffffffffff52c,in_stack_fffffffffffff528),
                     in_stack_fffffffffffff524);
          local_1d4 = 2;
        }
      }
    }
    else {
      if (((*(byte *)(in_RDI + 0x6c) & 1) == 0) || ((local_51 & 1) != 0)) {
        local_178 = in_RDI + 0x28;
        local_180._M_current =
             (LightHandle *)
             std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::begin
                       ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                        in_stack_fffffffffffff438);
        local_188 = (LightHandle *)
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::end
                              ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               in_stack_fffffffffffff438);
        while( true ) {
          auVar58 = auVar51._8_56_;
          bVar46 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                               *)in_stack_fffffffffffff440,
                              (__normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                               *)in_stack_fffffffffffff438);
          auVar61 = in_ZMM1._8_56_;
          if (!bVar46) break;
          local_190 = __gnu_cxx::
                      __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
                      ::operator*(&local_180);
          SVar65 = LightHandle::Le((LightHandle *)in_stack_fffffffffffff460,
                                   (Ray *)in_stack_fffffffffffff458,
                                   (SampledWavelengths *)in_stack_fffffffffffff450);
          auVar59._0_8_ = SVar65.values.values._8_8_;
          auVar59._8_56_ = auVar61;
          auVar52._0_8_ = SVar65.values.values._0_8_;
          auVar52._8_56_ = auVar58;
          uVar54 = auVar61._0_8_;
          uVar55 = auVar58._0_8_;
          local_1c0 = vmovlpd_avx(auVar52._0_16_);
          local_1b8 = vmovlpd_avx(auVar59._0_16_);
          SVar65 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff448,
                              (SampledSpectrum *)in_stack_fffffffffffff440);
          auVar44._8_8_ = uVar55;
          auVar44._0_8_ = SVar65.values.values._8_8_;
          auVar45._8_8_ = uVar54;
          auVar45._0_8_ = SVar65.values.values._0_8_;
          local_1b0 = vmovlpd_avx(auVar45);
          local_1a8 = vmovlpd_avx(auVar44);
          SVar65 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff440);
          auVar42._8_8_ = uVar54;
          auVar42._0_8_ = SVar65.values.values._8_8_;
          auVar43._8_8_ = uVar55;
          auVar43._0_8_ = SVar65.values.values._0_8_;
          local_1d0 = vmovlpd_avx(auVar43);
          local_1c8 = vmovlpd_avx(auVar42);
          SVar65 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff450,
                           (SampledSpectrum *)in_stack_fffffffffffff448);
          auVar40._8_8_ = uVar55;
          auVar40._0_8_ = SVar65.values.values._8_8_;
          auVar51 = ZEXT1664(auVar40);
          auVar41._8_8_ = uVar54;
          auVar41._0_8_ = SVar65.values.values._0_8_;
          in_ZMM1 = ZEXT1664(auVar41);
          local_1a0 = vmovlpd_avx(auVar41);
          local_198 = vmovlpd_avx(auVar40);
          SampledSpectrum::operator+=
                    ((SampledSpectrum *)in_stack_fffffffffffff450,
                     (SampledSpectrum *)in_stack_fffffffffffff448);
          __gnu_cxx::
          __normal_iterator<const_pbrt::LightHandle_*,_std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>_>
          ::operator++(&local_180);
        }
      }
      local_1d4 = 3;
    }
LAB_00799f4e:
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)0x799f5b);
    in_stack_fffffffffffff490 = local_1d4;
    if ((local_1d4 != 0) && (local_1d4 != 2)) {
      return (array<float,_4>)(array<float,_4>)local_10.values;
    }
  } while( true );
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;

    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                LightLiSample ls = sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls.L) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls.wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls.pLight))
                        L += SafeDiv(beta * f * ls.L,
                                     sampledLight->pdf * ls.pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
            specularBounce = bs.IsSpecular();
            ray = isect.SpawnRay(bs.wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}